

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drink_factory.hpp
# Opt level: O2

void __thiscall DrinkFactory::DrinkFactory(DrinkFactory *this)

{
  _Head_base<0UL,_CoffeeFactory_*,_false> _Var1;
  __uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_> *p_Var2;
  allocator<char> local_39;
  _Head_base<0UL,_CoffeeFactory_*,_false> local_38;
  key_type local_30;
  
  (this->factories)._M_h._M_buckets = &(this->factories)._M_h._M_single_bucket;
  (this->factories)._M_h._M_bucket_count = 1;
  (this->factories)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->factories)._M_h._M_element_count = 0;
  (this->factories)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->factories)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->factories)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::make_unique<CoffeeFactory>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"coffee",&local_39);
  p_Var2 = (__uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>
            *)std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,&local_30);
  _Var1._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (CoffeeFactory *)0x0;
  std::__uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>::
  reset(p_Var2,&(_Var1._M_head_impl)->super_AbstractHotDrinkFactory);
  std::__cxx11::string::~string((string *)&local_30);
  std::unique_ptr<CoffeeFactory,_std::default_delete<CoffeeFactory>_>::~unique_ptr
            ((unique_ptr<CoffeeFactory,_std::default_delete<CoffeeFactory>_> *)&local_38);
  std::make_unique<TeaFactory>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"tea",&local_39);
  p_Var2 = (__uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>
            *)std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,&local_30);
  _Var1._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (CoffeeFactory *)0x0;
  std::__uniq_ptr_impl<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>::
  reset(p_Var2,&(_Var1._M_head_impl)->super_AbstractHotDrinkFactory);
  std::__cxx11::string::~string((string *)&local_30);
  std::unique_ptr<TeaFactory,_std::default_delete<TeaFactory>_>::~unique_ptr
            ((unique_ptr<TeaFactory,_std::default_delete<TeaFactory>_> *)&local_38);
  return;
}

Assistant:

DrinkFactory()
	{
		factories["coffee"] = std::make_unique<CoffeeFactory>();
		factories["tea"] = std::make_unique<TeaFactory>();
	}